

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_x86.c
# Opt level: O3

void aes_ctr_xor_x86(aes_context *ctx,uint8_t *iv,uint8_t *buffer,size_t size)

{
  int nr;
  __m128i *key;
  uint *__src;
  uint extraout_XMM0_Da;
  ulong extraout_XMM0_Qa;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  undefined1 auVar1 [16];
  ulong extraout_XMM0_Qb;
  __m128i input;
  __m128i alVar2;
  uint8_t full [16];
  ulong local_38;
  ulong uStack_30;
  
  nr = (int)size;
  auVar1 = *(undefined1 (*) [16])iv;
  __src = (uint *)buffer;
  if (0xf < size) {
    do {
      alVar2[1]._0_4_ = ctx->nr;
      alVar2[0] = (longlong)ctx->key;
      alVar2[1]._4_4_ = 0;
      alVar2 = aes_encrypt_x86(alVar2,(__m128i *)buffer,nr);
      buffer = alVar2[1];
      *__src = *__src ^ extraout_XMM0_Da;
      __src[1] = __src[1] ^ extraout_XMM0_Db;
      __src[2] = __src[2] ^ extraout_XMM0_Dc;
      __src[3] = __src[3] ^ extraout_XMM0_Dd;
      auVar1 = pshufb(auVar1,_DAT_00106340);
      auVar1._0_8_ = auVar1._0_8_ + 1;
      auVar1 = pshufb(auVar1,_DAT_00106340);
      __src = __src + 4;
      size = size - 0x10;
    } while (0xf < size);
  }
  if (size != 0) {
    memcpy(&local_38,__src,size);
    memset((void *)((long)&local_38 + size),0,0x10 - size);
    input[1]._0_4_ = ctx->nr;
    input[0] = (longlong)ctx->key;
    input[1]._4_4_ = 0;
    aes_encrypt_x86(input,key,nr);
    local_38 = extraout_XMM0_Qa ^ local_38;
    uStack_30 = extraout_XMM0_Qb ^ uStack_30;
    memcpy(__src,&local_38,size);
  }
  return;
}

Assistant:

void aes_ctr_xor_x86(const aes_context* ctx, const uint8_t* iv, uint8_t* buffer, size_t size)
{
  const __m128i* key = (__m128i*)ctx->key;
  __m128i counter = _mm_loadu_si128((const __m128i*)iv);

  while (size >= 16)
  {
    __m128i block = aes_encrypt_x86(counter, key, ctx->nr);
    __m128i tmp = _mm_xor_si128(_mm_loadu_si128((const __m128i*)buffer), block);
    _mm_storeu_si128((__m128i*)buffer, tmp);

    counter = ctr_increment(counter);

    buffer += 16;
    size -= 16;
  }

  if (size != 0)
  {
    uint8_t full[16];
    memcpy(full, buffer, size);
    memset(full + size, 0, 16 - size);

    __m128i block = aes_encrypt_x86(counter, key, ctx->nr);
    __m128i tmp = _mm_xor_si128(_mm_loadu_si128((const __m128i*)full), block);
    _mm_storeu_si128((__m128i*)full, tmp);

    memcpy(buffer, full, size);
  }
}